

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskExporter.cpp
# Opt level: O0

void TaskExporter::exportTasks(vector<TaskNode,_std::allocator<TaskNode>_> *taskNodes,ostream *out)

{
  bool bVar1;
  reference this;
  string *psVar2;
  ostream *poVar3;
  TaskNode *taskNode;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TaskNode,_std::allocator<TaskNode>_> *__range1;
  ostream *out_local;
  vector<TaskNode,_std::allocator<TaskNode>_> *taskNodes_local;
  
  __end1 = std::vector<TaskNode,_std::allocator<TaskNode>_>::begin(taskNodes);
  taskNode = (TaskNode *)std::vector<TaskNode,_std::allocator<TaskNode>_>::end(taskNodes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_TaskNode_*,_std::vector<TaskNode,_std::allocator<TaskNode>_>_>
                                *)&taskNode);
    if (!bVar1) break;
    this = __gnu_cxx::
           __normal_iterator<const_TaskNode_*,_std::vector<TaskNode,_std::allocator<TaskNode>_>_>::
           operator*(&__end1);
    psVar2 = TaskNode::getName_abi_cxx11_(this);
    poVar3 = std::operator<<(out,(string *)psVar2);
    std::operator<<(poVar3,"\n");
    __gnu_cxx::
    __normal_iterator<const_TaskNode_*,_std::vector<TaskNode,_std::allocator<TaskNode>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void TaskExporter::exportTasks(const std::vector<TaskNode> &taskNodes, std::ostream &out) {
    for (const auto &taskNode : taskNodes)
        out << taskNode.getName() << "\n";
}